

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_uuid_unlink(intptr_t uuid,void *obj)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  char cVar5;
  byte bVar6;
  undefined8 *puVar7;
  fio_data_s *pfVar8;
  fio_data_s *pfVar9;
  int iVar10;
  undefined8 *puVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  long *plVar16;
  ulong uVar17;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  fio_lock_i ret;
  timespec local_48;
  void *pvVar18;
  
  pfVar9 = fio_data;
  if ((uuid < 0) || (uVar21 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar21)) {
LAB_00106521:
    piVar13 = __errno_location();
    *piVar13 = 9;
    return -1;
  }
  lVar22 = (long)(int)uVar21 * 0xa8;
  cVar5 = *(char *)((long)fio_data + lVar22 + 0x6d);
  if (cVar5 != (char)uuid) goto LAB_00106521;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar22 + 0x6e);
  cVar3 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  local_48.tv_sec._0_1_ = cVar3;
  pfVar8 = fio_data;
  while (fio_data = pfVar8, (char)local_48.tv_sec != '\0') {
    local_48.tv_sec = 0;
    local_48.tv_nsec = 1;
    nanosleep(&local_48,(timespec *)0x0);
    LOCK();
    pcVar1 = (char *)((long)pfVar9 + lVar22 + 0x6e);
    cVar3 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    local_48.tv_sec._0_1_ = cVar3;
    pfVar8 = fio_data;
  }
  if ((pfVar8->capa <= uVar21) || (*(char *)((long)pfVar8 + lVar22 + 0x6d) != cVar5)) {
    LOCK();
    puVar2 = (undefined1 *)((long)pfVar8 + lVar22 + 0x6e);
    uVar4 = *puVar2;
    *puVar2 = 0;
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar4);
    goto LAB_00106521;
  }
  if ((obj != (void *)0x0) && (lVar12 = *(long *)((long)pfVar8 + lVar22 + 0xd8), lVar12 != 0)) {
    if ((*(char *)((long)pfVar8 + lVar22 + 0xe0) != '\0') &&
       (*(long *)((long)pfVar8 + lVar22 + 200) != *(long *)((long)pfVar8 + lVar22 + 0xb8))) {
      fio_uuid_links_rehash((fio_uuid_links_s *)((long)pfVar8 + lVar22 + 0xb8));
      lVar12 = *(long *)((long)pfVar8 + lVar22 + 0xd8);
    }
    bVar6 = *(byte *)((long)pfVar8 + lVar22 + 0xe1);
    uVar15 = ~(-1L << (bVar6 & 0x3f));
    pvVar18 = (void *)0x0;
    if (bVar6 != 0) {
      pvVar18 = obj;
    }
    uVar17 = (ulong)pvVar18 ^ ((ulong)obj >> (bVar6 & 0x3f) | (long)obj << 0x40 - (bVar6 & 0x3f));
    lVar14 = (uVar17 & uVar15) * 0x10;
    pvVar18 = *(void **)(lVar12 + lVar14);
    if (pvVar18 == obj || pvVar18 == (void *)0x0) {
      puVar11 = (undefined8 *)(lVar12 + lVar14);
    }
    else {
      uVar20 = *(ulong *)((long)pfVar8 + lVar22 + 0xc0);
      uVar19 = 0x420;
      if (uVar20 < 0x181) {
        uVar19 = (uVar20 >> 2) * 0xb;
      }
      uVar20 = 0;
      do {
        if (uVar19 <= uVar20) goto LAB_0010659c;
        lVar14 = (uVar17 + 0xb + uVar20 & uVar15) * 0x10;
        puVar11 = (undefined8 *)(lVar12 + lVar14);
        pvVar18 = *(void **)(lVar12 + lVar14);
      } while ((pvVar18 != (void *)0x0) && (uVar20 = uVar20 + 0xb, pvVar18 != obj));
    }
    puVar7 = (undefined8 *)puVar11[1];
    if (puVar7 != (undefined8 *)0x0) {
      plVar16 = (long *)((long)pfVar8 + lVar22 + 0xb8);
      *plVar16 = *plVar16 + -1;
      *puVar7 = 0;
      lVar12 = *(long *)((long)pfVar8 + lVar22 + 200);
      lVar14 = *(long *)((long)pfVar8 + lVar22 + 0xd0);
      if (puVar7 == (undefined8 *)(lVar14 + lVar12 * 0x10 + -0x10)) {
        *puVar11 = 0;
        plVar16 = (long *)(lVar12 * 0x10 + lVar14 + -0x20);
        do {
          lVar12 = lVar12 + -1;
          if (lVar12 == 0) break;
          lVar14 = *plVar16;
          plVar16 = plVar16 + -2;
        } while (lVar14 == 0);
        *(long *)((long)pfVar8 + lVar22 + 200) = lVar12;
      }
      puVar11[1] = 0;
      iVar10 = 0;
      goto LAB_001065ac;
    }
  }
LAB_0010659c:
  piVar13 = __errno_location();
  *piVar13 = 0x6b;
  iVar10 = -1;
LAB_001065ac:
  LOCK();
  *(undefined1 *)((long)fio_data + lVar22 + 0x6e) = 0;
  UNLOCK();
  return iVar10;
}

Assistant:

int fio_uuid_unlink(intptr_t uuid, void *obj) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  /* default object comparison is always true */
  int ret =
      fio_uuid_links_remove(&uuid_data(uuid).links, (uintptr_t)obj, NULL, NULL);
  if (ret)
    errno = ENOTCONN;
  fio_unlock(&uuid_data(uuid).sock_lock);
  return ret;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  return -1;
}